

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O0

bool __thiscall
handlegraph::PathMetadata::for_each_step_of_sense_impl
          (PathMetadata *this,handle_t *visited,PathSense *sense,
          function<bool_(const_handlegraph::step_handle_t_&)> *iteratee)

{
  byte bVar1;
  anon_class_24_3_da7c0e10 *in_RSI;
  long *in_RDI;
  function<bool_(const_handlegraph::step_handle_t_&)> *this_00;
  function<bool_(const_handlegraph::step_handle_t_&)> local_40 [2];
  
  this_00 = local_40;
  std::function<bool(handlegraph::step_handle_t_const&)>::
  function<handlegraph::PathMetadata::for_each_step_of_sense_impl(handlegraph::handle_t_const&,handlegraph::PathSense_const&,std::function<bool(handlegraph::step_handle_t_const&)>const&)const::__0,void>
            (this_00,in_RSI);
  bVar1 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_RSI,this_00);
  std::function<bool_(const_handlegraph::step_handle_t_&)>::~function
            ((function<bool_(const_handlegraph::step_handle_t_&)> *)0x21133a);
  return (bool)(bVar1 & 1);
}

Assistant:

bool PathMetadata::for_each_step_of_sense_impl(const handle_t& visited, const PathSense& sense, const std::function<bool(const step_handle_t&)>& iteratee) const {
    return for_each_step_on_handle_impl(visited, [&](const step_handle_t& handle) {
        if (get_sense(get_path_handle_of_step(handle)) != sense) {
            // Skip this non-matching path's step
            return true;
        }
        // And emit any steps on matching paths
        return iteratee(handle);
    });
}